

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void move_player(wchar_t dir,_Bool disarm)

{
  byte *pbVar1;
  short sVar2;
  loc grid;
  loc grid1;
  player *p;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  loc grid_00;
  square *psVar7;
  monster_conflict *mon;
  command_conflict *pcVar8;
  player_upkeep *ppVar9;
  feature *pfVar10;
  char *fmt;
  
  grid_00 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
  psVar7 = square(cave,grid_00);
  sVar2 = psVar7->mon;
  mon = (monster_conflict *)cave_monster(cave,(int)sVar2);
  _Var3 = player_is_trapsafe(player);
  _Var4 = square_isdisarmabletrap(cave,grid_00);
  _Var5 = square_iscloseddoor(cave,grid_00);
  if (0 < sVar2) {
    _Var3 = monster_is_camouflaged((monster *)mon);
    if (_Var3) {
      become_aware((chunk *)cave,mon);
      monster_wake(mon,false,L'd');
    }
    else {
      py_attack(player,grid_00);
    }
    goto LAB_0012cfb7;
  }
  if ((disarm && _Var4 || _Var5) && (_Var5 = square_isknown(cave,grid_00), _Var5)) {
    wVar6 = cmd_get_nrepeats();
    if (wVar6 == L'\0') {
      cmd_set_repeat(L'c');
    }
    do_cmd_alter_aux(dir);
    goto LAB_0012cfb7;
  }
  if ((_Var4) && (player->upkeep->running != L'\0' && !_Var3)) {
    disturb(player);
LAB_0012ce26:
    ppVar9 = player->upkeep;
LAB_0012ce31:
    ppVar9->energy_use = L'\0';
    goto LAB_0012cfb7;
  }
  _Var3 = square_ispassable(cave,grid_00);
  if (_Var3) {
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    _Var3 = square_isdtrap(cave,grid);
    _Var4 = square_isdtrap(cave,grid_00);
    p = player;
    ppVar9 = player->upkeep;
    if (_Var3 != _Var4) {
      pbVar1 = (byte *)((long)&ppVar9->redraw + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    if ((ppVar9->running != L'\0') && (!_Var4 && ((~_Var3 | ppVar9->running_firststep) & 1U) == 0))
    {
      disturb(p);
      player->upkeep->energy_use = L'\0';
      return;
    }
    _Var3 = square_isdamaging(cave,grid_00);
    if (((_Var3) || (_Var3 = square_isfall(cave,grid_00), _Var3)) && (player->timed[4] == 0)) {
      pfVar10 = square_feat(cave,grid_00);
      wVar6 = player_check_terrain_damage(player,grid_00,false);
      if ((player->upkeep->running == L'\0') || (wVar6 == L'\0')) {
        if (((player->chp / 3 < wVar6) || (_Var3 = square_isfall(cave,grid_00), _Var3)) &&
           (_Var3 = get_check(pfVar10->walk_msg), !_Var3)) goto LAB_0012ce26;
      }
      else {
        _Var3 = get_check(pfVar10->run_msg);
        if (!_Var3) {
          ppVar9 = player->upkeep;
          ppVar9->running = L'\0';
          goto LAB_0012ce31;
        }
      }
    }
    grid1.x = (player->grid).x;
    grid1.y = (player->grid).y;
    monster_swap(grid1,grid_00);
    player_handle_post_move(player,true,false);
    cmdq_push(CMD_AUTOPICKUP);
    pcVar8 = cmdq_peek();
    pcVar8->background_command = 2;
    goto LAB_0012cfb7;
  }
  disturb(player);
  _Var3 = square_isknown(cave,grid_00);
  _Var4 = square_isrubble(cave,grid_00);
  if (_Var3) {
    if (_Var4) {
      msgt(0x10,"There is a pile of rubble blocking your way.");
      _Var3 = square_isrubble((chunk_conflict *)player->cave,grid_00);
LAB_0012ce9a:
      if (_Var3 != false) goto LAB_0012cfb7;
      goto LAB_0012cfa1;
    }
    _Var3 = square_iscloseddoor(cave,grid_00);
    if (_Var3) {
      msgt(0x10,"There is a door blocking your way.");
      _Var3 = square_iscloseddoor((chunk_conflict *)player->cave,grid_00);
      goto LAB_0012ce9a;
    }
    msgt(0x10,"There is a wall blocking your way.");
    _Var3 = square_ispassable((chunk_conflict *)player->cave,grid_00);
    if (((!_Var3) && (_Var3 = square_isrubble((chunk_conflict *)player->cave,grid_00), !_Var3)) &&
       (_Var3 = square_iscloseddoor((chunk_conflict *)player->cave,grid_00), !_Var3))
    goto LAB_0012cfb7;
    square_forget(cave,grid_00);
  }
  else {
    if (_Var4) {
      fmt = "You feel a pile of rubble blocking your way.";
    }
    else {
      _Var3 = square_iscloseddoor(cave,grid_00);
      if (_Var3) {
        fmt = "You feel a door blocking your way.";
      }
      else {
        fmt = "You feel a wall blocking your way.";
      }
    }
    msgt(0x10,fmt);
LAB_0012cfa1:
    square_memorize(cave,grid_00);
  }
  square_light_spot((chunk *)cave,grid_00);
LAB_0012cfb7:
  player->upkeep->running_firststep = false;
  return;
}

Assistant:

void move_player(int dir, bool disarm)
{
	struct loc grid = loc_sum(player->grid, ddgrid[dir]);

	int m_idx = square(cave, grid)->mon;
	struct monster *mon = cave_monster(cave, m_idx);
	bool trapsafe = player_is_trapsafe(player);
	bool trap = square_isdisarmabletrap(cave, grid);
	bool door = square_iscloseddoor(cave, grid);

	/* Many things can happen on movement */
	if (m_idx > 0) {
		/* Attack monsters */
		if (monster_is_camouflaged(mon)) {
			become_aware(cave, mon);

			/* Camouflaged monster wakes up and becomes aware */
			monster_wake(mon, false, 100);
		} else {
			py_attack(player, grid);
		}
	} else if (((trap && disarm) || door) && square_isknown(cave, grid)) {
		/* Auto-repeat if not already repeating */
		if (cmd_get_nrepeats() == 0)
			cmd_set_repeat(99);
		do_cmd_alter_aux(dir);
	} else if (trap && player->upkeep->running && !trapsafe) {
		/* Stop running before known traps */
		disturb(player);
		/* No move made so no energy spent. */
		player->upkeep->energy_use = 0;
	} else if (!square_ispassable(cave, grid)) {
		disturb(player);

		/* Notice unknown obstacles, mention known obstacles */
		if (!square_isknown(cave, grid)) {
			if (square_isrubble(cave, grid)) {
				msgt(MSG_HITWALL,
					 "You feel a pile of rubble blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			} else if (square_iscloseddoor(cave, grid)) {
				msgt(MSG_HITWALL, "You feel a door blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			} else {
				msgt(MSG_HITWALL, "You feel a wall blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			}
		} else {
			if (square_isrubble(cave, grid)) {
				msgt(MSG_HITWALL,
					 "There is a pile of rubble blocking your way.");
				if (!square_isrubble(player->cave, grid)) {
					square_memorize(cave, grid);
					square_light_spot(cave, grid);
				}
			} else if (square_iscloseddoor(cave, grid)) {
				msgt(MSG_HITWALL, "There is a door blocking your way.");
				if (!square_iscloseddoor(player->cave, grid)) {
					square_memorize(cave, grid);
					square_light_spot(cave, grid);
				}
			} else {
				msgt(MSG_HITWALL, "There is a wall blocking your way.");
				if (square_ispassable(player->cave, grid)
						|| square_isrubble(player->cave, grid)
						|| square_iscloseddoor(player->cave, grid)) {
					square_forget(cave, grid);
					square_light_spot(cave, grid);
				}
			}
		}
		/*
		 * No move but do not refund energy:  primarily so that
		 * confused moves while blind or without light take energy.
		 */
	} else {
		/* See if trap detection status will change */
		bool old_dtrap = square_isdtrap(cave, player->grid);
		bool new_dtrap = square_isdtrap(cave, grid);
		bool step = true;

		/* Note the change in the detect status */
		if (old_dtrap != new_dtrap)
			player->upkeep->redraw |= (PR_DTRAP);

		/* Disturb player if the player is about to leave the area */
		if (player->upkeep->running
				&& !player->upkeep->running_firststep
				&& old_dtrap && !new_dtrap) {
			disturb(player);
			/* No move made so no energy spent. */
			player->upkeep->energy_use = 0;
			return;
		}

		/*
		 * If not confused, allow check before moving into damaging
		 * terrain.
		 */
		if ((square_isdamaging(cave, grid) || square_isfall(cave, grid))
			&& !player->timed[TMD_CONFUSED]) {
			struct feature *feat = square_feat(cave, grid);
			int dam_taken = player_check_terrain_damage(player,
				grid, false);

			/*
			 * Check if running, or going to cost more than a
			 * third of hp.
			 */
			if (player->upkeep->running && dam_taken) {
				if (!get_check(feat->run_msg)) {
					player->upkeep->running = 0;
					step = false;
				}
			} else {
				if ((dam_taken > player->chp / 3) || square_isfall(cave, grid)){
					step = get_check(feat->walk_msg);
				}
			}
		}

		if (step) {
			/* Move player */
			monster_swap(player->grid, grid);
			player_handle_post_move(player, true, false);
			cmdq_push(CMD_AUTOPICKUP);
			/*
			 * The autopickup is a side effect of the move:
			 * whatever command triggered the move will be the
			 * target for CMD_REPEAT rather than repeating the
			 * autopickup, and the autopickup won't trigger
			 * bloodlust.
			 */
			cmdq_peek()->background_command = 2;
		} else {
			/* No move made so no energy spent. */
			player->upkeep->energy_use = 0;
		}
	}

	player->upkeep->running_firststep = false;
}